

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_row.cpp
# Opt level: O1

void __thiscall csv::internals::CSVFieldList::allocate(CSVFieldList *this)

{
  undefined1 auVar1 [16];
  _Elt_pointer puVar2;
  pointer *__ptr;
  ulong uVar3;
  __uniq_ptr_impl<csv::internals::RawCSVField,_std::default_delete<csv::internals::RawCSVField[]>_>
  local_18;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->_single_buffer_capacity;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(ZEXT816(0x18) * auVar1,8) == 0) {
    uVar3 = SUB168(ZEXT816(0x18) * auVar1,0);
  }
  local_18._M_t.
  super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
  .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl =
       (tuple<csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>)
       operator_new__(uVar3);
  std::
  deque<std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>,std::allocator<std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>>>
  ::
  emplace_back<std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>>
            ((deque<std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>,std::allocator<std::unique_ptr<csv::internals::RawCSVField[],std::default_delete<csv::internals::RawCSVField[]>>>>
              *)&this->buffers,
             (unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>
              *)&local_18);
  if ((_Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
       )local_18._M_t.
        super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
        .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl !=
      (RawCSVField *)0x0) {
    operator_delete__((void *)local_18._M_t.
                              super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                              .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>.
                              _M_head_impl);
  }
  this->_current_buffer_size = 0;
  puVar2 = (this->buffers).
           super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->buffers).
                super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    puVar2 = (this->buffers).
             super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  this->_back = puVar2[-1]._M_t.
                super___uniq_ptr_impl<csv::internals::RawCSVField,_std::default_delete<csv::internals::RawCSVField[]>_>
                ._M_t.
                super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl;
  return;
}

Assistant:

CSV_INLINE void CSVFieldList::allocate() {
            buffers.push_back(std::unique_ptr<RawCSVField[]>(new RawCSVField[_single_buffer_capacity]));

            _current_buffer_size = 0;
            _back = buffers.back().get();
        }